

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<bool>>(QDataStream *s,QList<bool> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  undefined1 *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<bool>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (undefined1 *)(ulong)local_3c;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_48);
      asize = local_48;
      if ((long)local_48 < 0) goto LAB_00174a98;
    }
  }
  else if (local_3c == 0xffffffff) {
LAB_00174a98:
    QDataStream::setStatus((Status)s);
    goto LAB_00174b2e;
  }
  QList<bool>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    do {
      local_3c = CONCAT31(local_3c._1_3_,0xaa);
      QDataStream::operator>>(s,(bool *)&local_3c);
      if (s[0x13] != (QDataStream)0x0) {
        QList<bool>::clear(c);
        break;
      }
      local_48 = (undefined1 *)CONCAT71(local_48._1_7_,local_3c._0_1_);
      QPodArrayOps<bool>::emplace<bool&>((QPodArrayOps<bool> *)c,(c->d).size,(bool *)&local_48);
      QList<bool>::end(c);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_00174b2e:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}